

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.hpp
# Opt level: O0

void __thiscall helics::GlobalTimeCoordinator::GlobalTimeCoordinator(GlobalTimeCoordinator *this)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  BaseTimeCoordinator *in_RDI;
  
  BaseTimeCoordinator::BaseTimeCoordinator(in_RDI);
  in_RDI->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__GlobalTimeCoordinator_009377e8;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[1]._vptr_BaseTimeCoordinator = (_func_int **)TVar1.internalTimeCode;
  *(undefined1 *)
   &in_RDI[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[1].dependencies.dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)TVar1.internalTimeCode;
  *(undefined1 *)
   &in_RDI[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].dependencies.dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 1;
  return;
}

Assistant:

GlobalTimeCoordinator() = default;